

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

string * __thiscall
absl::strings_internal::CatPieces_abi_cxx11_
          (string *__return_storage_ptr__,strings_internal *this,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces)

{
  const_iterator pbVar1;
  size_type sVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *piVar3;
  const_pointer __src;
  long lVar4;
  size_t this_size;
  string_view piece_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range2_1;
  char *out;
  char *begin;
  char *absl_raw_log_internal_filename;
  string death_message;
  string_view piece;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range2;
  uint64_t total_size;
  uint64_t kMaxSize;
  undefined1 local_20 [8];
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_local;
  string *result;
  
  pieces_local._M_array = pieces._M_array;
  local_20 = (undefined1  [8])this;
  pieces_local._M_len = (size_type)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __range2 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x0;
  __end2 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                     ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      local_20);
  pbVar1 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                     ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      local_20);
  for (; __end2 != pbVar1; __end2 = __end2 + 1) {
    death_message.field_2._8_8_ = __end2->_M_len;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       ((long)&death_message.field_2 + 8));
    __range2 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               ((long)&__range2->_M_array + sVar2);
  }
  STLStringResizeUninitialized<std::__cxx11::string,void>(__return_storage_ptr__,(size_t)__range2);
  piVar3 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
           std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  __end2_1 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                       ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        local_20);
  piece_1._M_str =
       (char *)std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                         ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)local_20);
  __range2_1 = piVar3;
  for (; __end2_1 != (const_iterator)piece_1._M_str; __end2_1 = __end2_1 + 1) {
    this_size = __end2_1->_M_len;
    piece_1._M_len = (size_t)__end2_1->_M_str;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_size);
    if (sVar2 != 0) {
      __src = std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_size);
      memcpy(__range2_1,__src,sVar2);
      __range2_1 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   ((long)&__range2_1->_M_array + sVar2);
    }
  }
  lVar4 = std::__cxx11::string::size();
  if (__range2_1 ==
      (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
      ((long)&piVar3->_M_array + lVar4)) {
    return __return_storage_ptr__;
  }
  __assert_fail("out == begin + result.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                ,0x95,
                "std::string absl::strings_internal::CatPieces(std::initializer_list<absl::string_view>)"
               );
}

Assistant:

std::string CatPieces(std::initializer_list<absl::string_view> pieces) {
  std::string result;
  // Use uint64_t to prevent size_t overflow. We assume it is not possible for
  // in memory strings to overflow a uint64_t.
  constexpr uint64_t kMaxSize = uint64_t{std::numeric_limits<size_t>::max()};
  uint64_t total_size = 0;
  for (absl::string_view piece : pieces) {
    total_size += piece.size();
  }
  ABSL_INTERNAL_CHECK(total_size <= kMaxSize, "size_t overflow");
  strings_internal::STLStringResizeUninitialized(
      &result, static_cast<size_t>(total_size));

  char* const begin = &result[0];
  char* out = begin;
  for (absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    if (this_size != 0) {
      memcpy(out, piece.data(), this_size);
      out += this_size;
    }
  }
  assert(out == begin + result.size());
  return result;
}